

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void prepare_horizontal_filter_coeff(int alpha,int sx,__m256i *coeff)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 *in_RDX;
  int in_ESI;
  int in_EDI;
  __m128i tmp_7;
  __m128i tmp_6;
  __m128i tmp_5;
  __m128i tmp_4;
  __m128i tmp_3;
  __m128i tmp_2;
  __m128i tmp_1;
  __m128i tmp_0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  __m128i tmp_15;
  __m128i tmp_14;
  __m128i tmp_13;
  __m128i tmp_12;
  __m128i tmp_11;
  __m128i tmp_10;
  __m128i tmp_9;
  __m128i tmp_8;
  
  auVar8._8_8_ = 0;
  auVar8._0_8_ = av1_filter_8bit[in_ESI >> 10];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 2 >> 10];
  auVar1 = vpunpcklwd_avx(auVar8,auVar1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = av1_filter_8bit[in_ESI + in_EDI >> 10];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 3 >> 10];
  auVar2 = vpunpcklwd_avx(auVar7,auVar2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 4 >> 10];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 6 >> 10];
  auVar3 = vpunpcklwd_avx(auVar6,auVar3);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 5 >> 10];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 7 >> 10];
  auVar4 = vpunpcklwd_avx(auVar5,auVar4);
  auVar5 = vpunpckldq_avx(auVar1,auVar3);
  auVar1 = vpunpckhdq_avx(auVar1,auVar3);
  auVar6 = vpunpckldq_avx(auVar2,auVar4);
  auVar2 = vpunpckhdq_avx(auVar2,auVar4);
  auVar3 = vpunpcklqdq_avx(auVar5,auVar6);
  local_298 = auVar3._0_8_;
  uStack_290 = auVar3._8_8_;
  *(undefined1 (*) [16])(in_RDX + 2) = auVar6;
  *in_RDX = local_298;
  in_RDX[1] = uStack_290;
  auVar3 = vpunpckhqdq_avx(auVar5,auVar6);
  local_2a8 = auVar3._0_8_;
  uStack_2a0 = auVar3._8_8_;
  *(undefined1 (*) [16])(in_RDX + 6) = auVar6;
  in_RDX[4] = local_2a8;
  in_RDX[5] = uStack_2a0;
  auVar3 = vpunpcklqdq_avx(auVar1,auVar2);
  local_2b8 = auVar3._0_8_;
  uStack_2b0 = auVar3._8_8_;
  *(undefined1 (*) [16])(in_RDX + 10) = auVar6;
  in_RDX[8] = local_2b8;
  in_RDX[9] = uStack_2b0;
  auVar1 = vpunpckhqdq_avx(auVar1,auVar2);
  local_2c8 = auVar1._0_8_;
  uStack_2c0 = auVar1._8_8_;
  in_RDX[0xc] = local_2c8;
  in_RDX[0xd] = uStack_2c0;
  in_RDX[0xe] = 0;
  in_RDX[0xf] = 0;
  return;
}

Assistant:

static inline void prepare_horizontal_filter_coeff(int alpha, int sx,
                                                   __m128i *coeff) {
  // Filter even-index pixels
  const __m128i tmp_0 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 0 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_1 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 1 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_2 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 2 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_3 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 3 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_4 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 4 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_5 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 5 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_6 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 6 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_7 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 7 * alpha) >> WARPEDDIFF_PREC_BITS]);

  // Coeffs 0 2 0 2 4 6 4 6 1 3 1 3 5 7 5 7 for pixels 0 2
  const __m128i tmp_8 = _mm_unpacklo_epi16(tmp_0, tmp_2);
  // Coeffs 0 2 0 2 4 6 4 6 1 3 1 3 5 7 5 7 for pixels 1 3
  const __m128i tmp_9 = _mm_unpacklo_epi16(tmp_1, tmp_3);
  // Coeffs 0 2 0 2 4 6 4 6 1 3 1 3 5 7 5 7 for pixels 4 6
  const __m128i tmp_10 = _mm_unpacklo_epi16(tmp_4, tmp_6);
  // Coeffs 0 2 0 2 4 6 4 6 1 3 1 3 5 7 5 7 for pixels 5 7
  const __m128i tmp_11 = _mm_unpacklo_epi16(tmp_5, tmp_7);

  // Coeffs 0 2 0 2 0 2 0 2 4 6 4 6 4 6 4 6 for pixels 0 2 4 6
  const __m128i tmp_12 = _mm_unpacklo_epi32(tmp_8, tmp_10);
  // Coeffs 1 3 1 3 1 3 1 3 5 7 5 7 5 7 5 7 for pixels 0 2 4 6
  const __m128i tmp_13 = _mm_unpackhi_epi32(tmp_8, tmp_10);
  // Coeffs 0 2 0 2 0 2 0 2 4 6 4 6 4 6 4 6 for pixels 1 3 5 7
  const __m128i tmp_14 = _mm_unpacklo_epi32(tmp_9, tmp_11);
  // Coeffs 1 3 1 3 1 3 1 3 5 7 5 7 5 7 5 7 for pixels 1 3 5 7
  const __m128i tmp_15 = _mm_unpackhi_epi32(tmp_9, tmp_11);

  // Coeffs 0 2 for pixels 0 2 4 6 1 3 5 7
  coeff[0] = _mm_unpacklo_epi64(tmp_12, tmp_14);
  // Coeffs 4 6 for pixels 0 2 4 6 1 3 5 7
  coeff[1] = _mm_unpackhi_epi64(tmp_12, tmp_14);
  // Coeffs 1 3 for pixels 0 2 4 6 1 3 5 7
  coeff[2] = _mm_unpacklo_epi64(tmp_13, tmp_15);
  // Coeffs 5 7 for pixels 0 2 4 6 1 3 5 7
  coeff[3] = _mm_unpackhi_epi64(tmp_13, tmp_15);
}